

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O2

void Emb_ManCreateRefsSpecial(Gia_Man_t *p)

{
  undefined1 *puVar1;
  uint uVar2;
  ulong uVar3;
  int iVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  int iVar7;
  Gia_Obj_t *pObjD1;
  Gia_Obj_t *pObjD0;
  Gia_Obj_t *local_40;
  Gia_Obj_t *local_38;
  
  if (p->pRefs != (int *)0x0) {
    __assert_fail("p->pRefs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                  ,0x155,"void Emb_ManCreateRefsSpecial(Gia_Man_t *)");
  }
  Gia_ManCleanMark0(p);
  Gia_ManCreateRefs(p);
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManObj(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    uVar3 = *(ulong *)pGVar5;
    uVar6 = uVar3 & 0x1fffffff;
    if (uVar6 != 0x1fffffff && -1 < (int)(uint)uVar3) {
      if (((uint)uVar3 >> 0x1e & 1) != 0) {
        __assert_fail("pObj->fMark0 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                      ,0x15a,"void Emb_ManCreateRefsSpecial(Gia_Man_t *)");
      }
      if ((((byte)(*(uint *)(pGVar5 + -uVar6) >> 0x1e) & 1) == 0 &&
           (*(uint *)(pGVar5 + -uVar6) & 0x9fffffff) != 0x9fffffff) &&
         (uVar2 = *(uint *)(pGVar5 + -(ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff)),
         ((byte)(uVar2 >> 0x1e) & 1) == 0 && (uVar2 & 0x9fffffff) != 0x9fffffff)) {
        iVar4 = Gia_ObjIsMuxType(pGVar5);
        if (iVar4 != 0) {
          pGVar5->field_0x3 = pGVar5->field_0x3 | 0x40;
          pGVar5[-uVar6].field_0x3 = pGVar5[-uVar6].field_0x3 | 0x40;
          puVar1 = &pGVar5[-(ulong)((uint)(uVar3 >> 0x20) & 0x1fffffff)].field_0x3;
          *puVar1 = *puVar1 | 0x40;
          pGVar5 = Gia_ObjRecognizeMux(pGVar5,&local_40,&local_38);
          Gia_ObjRefDec(p,(Gia_Obj_t *)((ulong)pGVar5 & 0xfffffffffffffffe));
          if ((Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe) ==
              (Gia_Obj_t *)((ulong)local_40 & 0xfffffffffffffffe)) {
            Gia_ObjRefDec(p,(Gia_Obj_t *)((ulong)local_38 & 0xfffffffffffffffe));
          }
        }
      }
    }
  }
  for (iVar7 = 0; iVar7 < p->nObjs; iVar7 = iVar7 + 1) {
    pGVar5 = Gia_ManObj(p,iVar7);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pGVar5 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar5) {
      iVar4 = Gia_ObjRefNum(p,pGVar5);
      if (iVar4 < 1) {
        __assert_fail("Gia_ObjRefNum(p, pObj) > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaEmbed.c"
                      ,0x16f,"void Emb_ManCreateRefsSpecial(Gia_Man_t *)");
      }
    }
  }
  Gia_ManCleanMark0(p);
  return;
}

Assistant:

void Emb_ManCreateRefsSpecial( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj, * pFan0, * pFan1;
    Gia_Obj_t * pObjC, * pObjD0, * pObjD1;
    int i;
    assert( p->pRefs == NULL );
    Gia_ManCleanMark0( p );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        assert( pObj->fMark0 == 0 );
        pFan0 = Gia_ObjFanin0(pObj);
        pFan1 = Gia_ObjFanin1(pObj);
        // skip nodes whose fanins are PIs or are already marked
        if ( Gia_ObjIsCi(pFan0) || pFan0->fMark0 || 
             Gia_ObjIsCi(pFan1) || pFan1->fMark0 )
             continue;
        // skip nodes that are not MUX type
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        // the node is MUX type, mark it and its fanins
        pObj->fMark0  = 1;
        pFan0->fMark0 = 1;
        pFan1->fMark0 = 1;
        // deref the control 
        pObjC = Gia_ObjRecognizeMux( pObj, &pObjD1, &pObjD0 );
        Gia_ObjRefDec( p, Gia_Regular(pObjC) );
        if ( Gia_Regular(pObjD0) == Gia_Regular(pObjD1) )
            Gia_ObjRefDec( p, Gia_Regular(pObjD0) );
    }
    Gia_ManForEachAnd( p, pObj, i )
        assert( Gia_ObjRefNum(p, pObj) > 0 );
    Gia_ManCleanMark0( p );
}